

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::mktree(Path *this)

{
  bool bVar1;
  __mode_t extraout_EDX;
  __mode_t extraout_EDX_00;
  __mode_t __mode;
  Path *__path;
  Path p;
  Path local_30;
  
  if (((this->m_path)._M_string_length != 1) || (*(this->m_path)._M_dataplus._M_p != '/')) {
    bVar1 = is_directory(this);
    if (!bVar1) {
      __path = this;
      dirname(&local_30,(char *)this);
      bVar1 = is_directory(&local_30);
      __mode = extraout_EDX;
      if (!bVar1) {
        mktree(&local_30);
        __mode = extraout_EDX_00;
      }
      mkdir(this,(char *)__path,__mode);
      std::__cxx11::string::_M_dispose();
    }
  }
  return;
}

Assistant:

void Path::mktree() const
{
  // Root is required to exist
  if (is_root())
    return;

  if (!is_directory()) {
    Path p = parent();

    if (!p.is_directory()) {
      p.mktree();
    }

    mkdir();
  }

}